

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O2

void cpptrace::print_frame
               (ostream *stream,bool color,uint frame_number_width,size_t counter,
               stacktrace_frame *frame)

{
  undefined7 in_register_00000031;
  char (*args_1) [10];
  char **in_R9;
  bool bVar1;
  char *reset;
  char *blue;
  string line;
  char *yellow;
  char *green;
  _Alloc_hider in_stack_ffffffffffffff78;
  undefined1 local_68 [16];
  string local_58;
  char *local_38;
  char *local_30;
  char *local_28;
  uint local_1c;
  size_t local_18;
  
  args_1 = (char (*) [10])&local_18;
  local_68._0_8_ = "\x1b[0m";
  bVar1 = (int)CONCAT71(in_register_00000031,color) == 0;
  if (bVar1) {
    local_68._0_8_ = "";
  }
  local_28 = "\x1b[32m";
  if (bVar1) {
    local_28 = "";
  }
  local_30 = "\x1b[33m";
  if (bVar1) {
    local_30 = "";
  }
  local_68._8_8_ = "\x1b[34m";
  if (bVar1) {
    local_68._8_8_ = "";
  }
  local_1c = frame_number_width;
  local_18 = counter;
  microfmt::format<unsigned_int&,unsigned_long&>
            ((string *)(local_68 + 0x10),(microfmt *)"#{<{}} ",(char *)&local_1c,(uint *)args_1,
             (unsigned_long *)args_1);
  if (frame->is_inline == true) {
    local_38 = (char *)0x12;
    microfmt::format<unsigned_long,char_const(&)[10]>
              ((string *)&stack0xffffffffffffff78,(microfmt *)"{<{}}",(char *)&local_38,
               (unsigned_long *)"(inlined)",args_1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_68 + 0x10),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff78);
  }
  else {
    local_38 = (char *)0x10;
    in_R9 = (char **)local_68;
    microfmt::format<char_const*const&,unsigned_long,unsigned_long_const&,char_const*const&>
              ((string *)&stack0xffffffffffffff78,(microfmt *)"{}0x{>{}:0h}{}",local_68 + 8,
               &local_38,&frame->raw_address,(unsigned_long *)in_R9,
               (char **)in_stack_ffffffffffffff78._M_p);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_68 + 0x10),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff78);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  if ((frame->symbol)._M_string_length != 0) {
    microfmt::format<char_const*const&,std::__cxx11::string_const&,char_const*const&>
              ((string *)&stack0xffffffffffffff78,(microfmt *)" in {}{}{}",(char *)&local_30,
               (char **)&frame->symbol,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,in_R9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_68 + 0x10),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  }
  if ((frame->filename)._M_string_length != 0) {
    microfmt::format<char_const*const&,std::__cxx11::string_const&,char_const*const&>
              ((string *)&stack0xffffffffffffff78,(microfmt *)" at {}{}{}",(char *)&local_28,
               (char **)&frame->filename,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,in_R9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_68 + 0x10),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    if ((frame->line).raw_value != 0xffffffff) {
      microfmt::format<char_const*const&,unsigned_int_const&,char_const*const&>
                ((string *)&stack0xffffffffffffff78,(microfmt *)":{}{}{}",local_68 + 8,
                 (char **)&frame->line,(uint *)local_68,in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_68 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff78);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
      if ((frame->column).raw_value != 0xffffffff) {
        microfmt::format<char_const*const&,unsigned_int_const&,char_const*const&>
                  ((string *)&stack0xffffffffffffff78,(microfmt *)":{}{}{}",local_68 + 8,
                   (char **)&frame->column,(uint *)local_68,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_68 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff78);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
      }
    }
  }
  std::operator<<(stream,(string *)(local_68 + 0x10));
  std::__cxx11::string::~string((string *)(local_68 + 0x10));
  return;
}

Assistant:

void print_frame(
        std::ostream& stream,
        bool color,
        unsigned frame_number_width,
        std::size_t counter,
        const stacktrace_frame& frame
    ) {
        const auto reset   = color ? RESET : "";
        const auto green   = color ? GREEN : "";
        const auto yellow  = color ? YELLOW : "";
        const auto blue    = color ? BLUE : "";
        std::string line = microfmt::format("#{<{}} ", frame_number_width, counter);
        if(frame.is_inline) {
            line += microfmt::format("{<{}}", 2 * sizeof(frame_ptr) + 2, "(inlined)");
        } else {
            line += microfmt::format("{}0x{>{}:0h}{}", blue, 2 * sizeof(frame_ptr), frame.raw_address, reset);
        }
        if(!frame.symbol.empty()) {
            line += microfmt::format(" in {}{}{}", yellow, frame.symbol, reset);
        }
        if(!frame.filename.empty()) {
            line += microfmt::format(" at {}{}{}", green, frame.filename, reset);
            if(frame.line.has_value()) {
                line += microfmt::format(":{}{}{}", blue, frame.line.value(), reset);
                if(frame.column.has_value()) {
                    line += microfmt::format(":{}{}{}", blue, frame.column.value(), reset);
                }
            }
        }
        stream << line;
    }